

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

Promise<void> __thiscall
capnp::
Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
::sendIgnoringResult
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
           *this)

{
  long in_RSI;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  RemotePromise<capnp::AnyPointer> local_40;
  
  (**(code **)**(undefined8 **)(in_RSI + 0x30))(&local_40,*(undefined8 **)(in_RSI + 0x30));
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x28));
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::ignoreResult
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)this);
  RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Request<Params, Results>::sendIgnoringResult() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  return kj::mv(typelessPromise).ignoreResult();
}